

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O1

void __thiscall Assimp::B3DImporter::ReadTRIS(B3DImporter *this,int v0)

{
  __uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_> _Var1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  tuple<aiMesh_*,_std::default_delete<aiMesh>_> tVar6;
  ulong *puVar7;
  aiFace *paVar8;
  uint *puVar9;
  B3DImporter *pBVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  aiFace *paVar15;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> mesh;
  __uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_> local_78;
  undefined1 local_70 [32];
  _Base_ptr local_50;
  
  uVar2 = ReadInt(this);
  uVar13 = 0;
  if ((uVar2 != 0xffffffff) &&
     (((int)uVar2 < 0 ||
      (uVar13 = uVar2,
      (int)((ulong)((long)(this->_materials).
                          super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->_materials).
                         super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) <= (int)uVar2)))) {
    local_50 = (_Base_ptr)&stack0xffffffffffffffc0;
    pBVar10 = (B3DImporter *)&stack0xffffffffffffffb0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xffffffffffffffb0,"Bad material id","");
    Fail(pBVar10,(string *)&stack0xffffffffffffffb0);
  }
  tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>)operator_new(0x520);
  *(undefined8 *)
   tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
   super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl = 0;
  *(uint *)((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 8) = 0;
  memset((aiVector3D **)
         ((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x10),0,0xcc);
  *(aiBone ***)
   ((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xe0) = (aiBone **)0x0;
  *(undefined8 *)
   ((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xe8) = 0;
  *(char *)((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xf0) = '\0';
  memset((char *)((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                        super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xf1),0x1b,0x3ff);
  *(uint *)((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x4f0) = 0;
  *(aiAnimMesh ***)
   ((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x4f8) = (aiAnimMesh **)0x0;
  *(undefined8 *)
   ((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x500) = 0;
  *(undefined8 *)
   ((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x508) = 0;
  ((aiVector3D *)
  ((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
         super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x510))->x = 0.0;
  ((aiVector3D *)
  ((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
         super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x510))->y = 0.0;
  *(float *)((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                   super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x518) = 0.0;
  *(aiVector3D **)
   ((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x70) = (aiVector3D *)0x0;
  *(aiVector3D **)
   ((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x78) = (aiVector3D *)0x0;
  *(aiVector3D **)
   ((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x80) = (aiVector3D *)0x0;
  *(aiVector3D **)
   ((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x88) = (aiVector3D *)0x0;
  *(aiVector3D **)
   ((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x90) = (aiVector3D *)0x0;
  *(aiVector3D **)
   ((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x98) = (aiVector3D *)0x0;
  *(aiVector3D **)
   ((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xa0) = (aiVector3D *)0x0;
  *(aiVector3D **)
   ((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xa8) = (aiVector3D *)0x0;
  ((uint *)((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xb0))[0] = 0;
  ((uint *)((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xb0))[1] = 0;
  ((uint *)((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xb8))[0] = 0;
  ((uint *)((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xb8))[1] = 0;
  ((uint *)((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xc0))[0] = 0;
  ((uint *)((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xc0))[1] = 0;
  ((uint *)((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 200))[0] = 0;
  ((uint *)((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 200))[1] = 0;
  *(aiColor4D **)
   ((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x30) = (aiColor4D *)0x0;
  *(aiColor4D **)
   ((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x38) = (aiColor4D *)0x0;
  *(aiColor4D **)
   ((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x40) = (aiColor4D *)0x0;
  *(aiColor4D **)
   ((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x48) = (aiColor4D *)0x0;
  *(aiColor4D **)
   ((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x50) = (aiColor4D *)0x0;
  *(aiColor4D **)
   ((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x58) = (aiColor4D *)0x0;
  *(aiColor4D **)
   ((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x60) = (aiColor4D *)0x0;
  *(aiColor4D **)
   ((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x68) = (aiColor4D *)0x0;
  *(uint *)((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xe8) = uVar13;
  *(uint *)((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 8) = 0;
  *(undefined4 *)
   tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
   super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl = 4;
  uVar13 = (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish[-1] - this->_pos;
  uVar12 = (ulong)uVar13 / 0xc;
  local_78._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
       (tuple<aiMesh_*,_std::default_delete<aiMesh>_>)
       (tuple<aiMesh_*,_std::default_delete<aiMesh>_>)
       tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
       super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl;
  puVar7 = (ulong *)operator_new__(uVar12 * 0x10 + 8);
  *puVar7 = uVar12;
  paVar15 = (aiFace *)(puVar7 + 1);
  if (0xb < uVar13) {
    paVar8 = paVar15;
    do {
      paVar8->mNumIndices = 0;
      paVar8->mIndices = (uint *)0x0;
      paVar8 = paVar8 + 1;
    } while (paVar8 != paVar15 + uVar12);
  }
  *(aiFace **)
   ((long)tVar6.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xd0) = paVar15;
  if (0xb < uVar13) {
    uVar2 = 1;
    if (1 < uVar13 / 0xc) {
      uVar2 = uVar13 / 0xc;
    }
    do {
      iVar3 = ReadInt(this);
      iVar4 = ReadInt(this);
      iVar5 = ReadInt(this);
      uVar13 = iVar3 + v0;
      if (((((int)uVar13 < 0) ||
           (iVar3 = (int)((ulong)((long)(this->_vertices).
                                        super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->_vertices).
                                       super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                    -0x49249249, iVar3 <= (int)uVar13)) || (uVar11 = iVar4 + v0, (int)uVar11 < 0))
         || (((iVar3 <= (int)uVar11 || (uVar14 = iVar5 + v0, (int)uVar14 < 0)) ||
             (iVar3 <= (int)uVar14)))) {
        local_70._0_8_ = local_70 + 0x10;
        pBVar10 = (B3DImporter *)local_70;
        std::__cxx11::string::_M_construct<char_const*>((string *)pBVar10,"Bad triangle index","");
        Fail(pBVar10,(string *)local_70);
      }
      paVar15->mNumIndices = 3;
      puVar9 = (uint *)operator_new__(0xc);
      paVar15->mIndices = puVar9;
      *puVar9 = uVar13;
      puVar9[1] = uVar11;
      puVar9[2] = uVar14;
      *(uint *)((long)local_78._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                      super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 8) =
           *(uint *)((long)local_78._M_t.
                           super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                           super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 8) + 1;
      paVar15 = paVar15 + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  std::
  vector<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>,std::allocator<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>>>
  ::emplace_back<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>>
            ((vector<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>,std::allocator<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>>>
              *)&this->_meshes,(unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *)&local_78);
  _Var1._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
       local_78._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
       super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl;
  if (local_78._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
      super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>)0x0) {
    aiMesh::~aiMesh((aiMesh *)
                    local_78._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                    super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl);
    operator_delete((void *)_Var1._M_t.
                            super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                            super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void B3DImporter::ReadTRIS( int v0 ){
    int matid=ReadInt();
    if( matid==-1 ){
        matid=0;
    }else if( matid<0 || matid>=(int)_materials.size() ){
#ifdef DEBUG_B3D
        cout<<"material id="<<matid<<endl;
#endif
        Fail( "Bad material id" );
    }

    std::unique_ptr<aiMesh> mesh(new aiMesh);

    mesh->mMaterialIndex=matid;
    mesh->mNumFaces=0;
    mesh->mPrimitiveTypes=aiPrimitiveType_TRIANGLE;

    int n_tris=ChunkSize()/12;
    aiFace *face=mesh->mFaces=new aiFace[n_tris];

    for( int i=0;i<n_tris;++i ){
        int i0=ReadInt()+v0;
        int i1=ReadInt()+v0;
        int i2=ReadInt()+v0;
        if( i0<0 || i0>=(int)_vertices.size() || i1<0 || i1>=(int)_vertices.size() || i2<0 || i2>=(int)_vertices.size() ){
#ifdef DEBUG_B3D
            cout<<"Bad triangle index: i0="<<i0<<", i1="<<i1<<", i2="<<i2<<endl;
#endif
            Fail( "Bad triangle index" );
            continue;
        }
        face->mNumIndices=3;
        face->mIndices=new unsigned[3];
        face->mIndices[0]=i0;
        face->mIndices[1]=i1;
        face->mIndices[2]=i2;
        ++mesh->mNumFaces;
        ++face;
    }

    _meshes.emplace_back( std::move(mesh) );
}